

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O0

bool __thiscall QLayout::activate(QLayout *this)

{
  bool bVar1;
  QLayoutPrivate *pQVar2;
  QObject *pQVar3;
  QLayoutPrivate *this_00;
  undefined8 uVar4;
  undefined8 uVar5;
  QLayout *this_01;
  pointer pQVar6;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  bool bVar7;
  bool bVar8;
  bool heightSet;
  bool widthSet;
  uint explMax;
  uint explMin;
  QWidgetPrivate *md;
  QWidget *mw;
  QLayoutPrivate *d;
  QSize ms_1;
  QSize ms;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  uint in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffef4;
  QSize *in_stack_fffffffffffffef8;
  QWidget *in_stack_ffffffffffffff00;
  QLayoutPrivate *in_stack_ffffffffffffff18;
  uint local_d8;
  uint local_d4;
  QLayout *in_stack_ffffffffffffff30;
  bool local_89;
  QString local_40;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QLayout *)0x33d4d6);
  if ((((byte)pQVar2->field_0x8c >> 1 & 1) == 0) ||
     (pQVar3 = QObject::parent((QObject *)0x33d4fc), pQVar3 == (QObject *)0x0)) {
    local_89 = false;
  }
  else if ((pQVar2->field_0x8c & 1) == 0) {
    QObject::parent((QObject *)0x33d52e);
    local_89 = activate((QLayout *)pQVar2);
  }
  else if (((byte)pQVar2->field_0x8c >> 2 & 1) == 0) {
    this_00 = (QLayoutPrivate *)QObject::parent((QObject *)0x33d573);
    if (this_00 == (QLayoutPrivate *)0x0) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,
                 in_stack_fffffffffffffef4,
                 (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      (**(code **)*in_RDI)();
      uVar4 = QMetaObject::className();
      QObject::objectName();
      QtPrivate::asString(&local_40);
      uVar5 = QString::utf16();
      QMessageLogger::warning
                (local_28,"QLayout::activate: %s \"%ls\" does not have a main widget",uVar4,uVar5);
      QString::~QString((QString *)0x33d60f);
      local_89 = false;
    }
    else {
      activateRecursiveHelper((QLayoutItem *)in_stack_ffffffffffffff00);
      QWidget::d_func((QWidget *)0x33d634);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x33d647);
      if (bVar1) {
        pQVar6 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                           ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x33d65b);
        local_d4 = (uint)(*(ushort *)&pQVar6->field_0x7c & 3);
      }
      else {
        local_d4 = 0;
      }
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x33d68a);
      if (bVar1) {
        pQVar6 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                           ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x33d69e);
        local_d8 = (uint)(*(ushort *)&pQVar6->field_0x7c >> 2 & 3);
      }
      else {
        local_d8 = 0;
      }
      this_01 = (QLayout *)(ulong)pQVar2->constraint;
      switch(this_01) {
      case (QLayout *)0x0:
        bVar7 = (local_d4 & 1) != 0;
        bVar8 = (local_d4 & 2) != 0;
        bVar1 = QWidget::isWindow((QWidget *)
                                  CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        if (bVar1) {
          totalMinimumSize(in_stack_ffffffffffffff30);
          if (bVar7) {
            QWidget::minimumSize(in_stack_ffffffffffffff00);
            QSize::width((QSize *)0x33d86d);
            QSize::setWidth((QSize *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            in_stack_fffffffffffffeec);
          }
          if (bVar8) {
            QWidget::minimumSize(in_stack_ffffffffffffff00);
            QSize::height((QSize *)0x33d8a2);
            QSize::setHeight((QSize *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                             in_stack_fffffffffffffeec);
          }
          QWidget::setMinimumSize(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        }
        else if ((!bVar7) || (!bVar8)) {
          QWidget::minimumSize(in_stack_ffffffffffffff00);
          if (!bVar7) {
            QSize::setWidth((QSize *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            in_stack_fffffffffffffeec);
          }
          if (!bVar8) {
            QSize::setHeight((QSize *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                             in_stack_fffffffffffffeec);
          }
          QWidget::setMinimumSize(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        }
        break;
      case (QLayout *)0x1:
        break;
      case (QLayout *)0x2:
        totalMinimumSize(in_stack_ffffffffffffff30);
        QWidget::setMinimumSize(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        break;
      case (QLayout *)0x3:
        totalSizeHint(in_stack_ffffffffffffff30);
        QWidget::setFixedSize(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        in_stack_ffffffffffffff18 = this_00;
        break;
      case (QLayout *)0x4:
        totalMaximumSize(this_01);
        QWidget::setMaximumSize(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        break;
      case (QLayout *)0x5:
        pQVar2 = this_00;
        totalMinimumSize(in_stack_ffffffffffffff30);
        QWidget::setMinimumSize(in_stack_ffffffffffffff00,(QSize *)pQVar2);
        totalMaximumSize(this_01);
        QWidget::setMaximumSize((QWidget *)this_00,(QSize *)pQVar2);
      }
      QLayoutPrivate::doResize(in_stack_ffffffffffffff18);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x33d950);
      if (bVar1) {
        pQVar6 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                           ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x33d96c);
        *(ushort *)&pQVar6->field_0x7c =
             *(ushort *)&pQVar6->field_0x7c & 0xfffc | (ushort)local_d4 & 3;
        pQVar6 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                           ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x33d99c);
        *(ushort *)&pQVar6->field_0x7c =
             *(ushort *)&pQVar6->field_0x7c & 0xfff3 | ((ushort)local_d8 & 3) << 2;
        in_stack_fffffffffffffef0 = local_d4;
        in_stack_fffffffffffffef4 = local_d8;
      }
      QWidget::updateGeometry
                ((QWidget *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      local_89 = true;
    }
  }
  else {
    local_89 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_89;
}

Assistant:

bool QLayout::activate()
{
    Q_D(QLayout);
    if (!d->enabled || !parent())
        return false;
    if (!d->topLevel)
        return static_cast<QLayout*>(parent())->activate();
    if (d->activated)
        return false;
    QWidget *mw = static_cast<QWidget*>(parent());
    if (Q_UNLIKELY(!mw)) {
        qWarning("QLayout::activate: %s \"%ls\" does not have a main widget",
                 metaObject()->className(), qUtf16Printable(objectName()));
        return false;
    }
    activateRecursiveHelper(this);

    QWidgetPrivate *md = mw->d_func();
    uint explMin = md->extra ? md->extra->explicitMinSize : 0;
    uint explMax = md->extra ? md->extra->explicitMaxSize : 0;

    switch (d->constraint) {
    case SetFixedSize:
        // will trigger resize
        mw->setFixedSize(totalSizeHint());
        break;
    case SetMinimumSize:
        mw->setMinimumSize(totalMinimumSize());
        break;
    case SetMaximumSize:
        mw->setMaximumSize(totalMaximumSize());
        break;
    case SetMinAndMaxSize:
        mw->setMinimumSize(totalMinimumSize());
        mw->setMaximumSize(totalMaximumSize());
        break;
    case SetDefaultConstraint: {
        bool widthSet = explMin & Qt::Horizontal;
        bool heightSet = explMin & Qt::Vertical;
        if (mw->isWindow()) {
            QSize ms = totalMinimumSize();
            if (widthSet)
                ms.setWidth(mw->minimumSize().width());
            if (heightSet)
                ms.setHeight(mw->minimumSize().height());
            mw->setMinimumSize(ms);
        } else if (!widthSet || !heightSet) {
            QSize ms = mw->minimumSize();
            if (!widthSet)
                ms.setWidth(0);
            if (!heightSet)
                ms.setHeight(0);
            mw->setMinimumSize(ms);
        }
        break;
    }
    case SetNoConstraint:
        break;
    }

    d->doResize();

    if (md->extra) {
        md->extra->explicitMinSize = explMin;
        md->extra->explicitMaxSize = explMax;
    }
    // ideally only if sizeHint() or sizePolicy() has changed
    mw->updateGeometry();
    return true;
}